

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O0

optional<sai::VirtualFileEntry> * __thiscall
sai::VirtualFileSystem::GetEntry
          (optional<sai::VirtualFileEntry> *__return_storage_ptr__,VirtualFileSystem *this,
          char *Path)

{
  VirtualPage *pVVar1;
  uint uVar2;
  int iVar3;
  reference __s;
  reference pvVar4;
  size_t sVar5;
  reference pvVar6;
  bool bVar7;
  undefined1 local_2084 [4];
  uint32_t NextPageIndex;
  VirtualPage TablePage;
  uint32_t PageIndex;
  ulong local_1078;
  size_t CurPageIndex;
  size_t CurEntry;
  char *CurToken;
  char *PathDelim;
  allocator<char> local_1041;
  undefined1 local_1040 [8];
  string CurPath;
  VirtualPage CurPage;
  char *Path_local;
  VirtualFileSystem *this_local;
  
  pVVar1 = (VirtualPage *)((long)&CurPath.field_2 + 8);
  memset(pVVar1,0,0x1000);
  Read<sai::VirtualPage>(this,0x2000,pVVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1040,Path,&local_1041);
  std::allocator<char>::~allocator(&local_1041);
  CurToken = "./";
  __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1040,0
                  );
  CurEntry = (size_t)strtok(__s,CurToken);
  CurPageIndex = 0;
  local_1078 = 0;
  do {
    while( true ) {
      bVar7 = false;
      if (CurPageIndex < 0x40) {
        pvVar4 = std::array<sai::FATEntry,_64UL>::operator[]
                           ((array<sai::FATEntry,_64UL> *)((long)&CurPath.field_2 + 8),CurPageIndex)
        ;
        bVar7 = false;
        if (pvVar4->Flags != 0) {
          bVar7 = CurEntry != 0;
        }
      }
      sVar5 = CurEntry;
      if (!bVar7) {
        std::optional<sai::VirtualFileEntry>::optional(__return_storage_ptr__);
        goto LAB_0010ff90;
      }
      pvVar4 = std::array<sai::FATEntry,_64UL>::operator[]
                         ((array<sai::FATEntry,_64UL> *)((long)&CurPath.field_2 + 8),CurPageIndex);
      iVar3 = strcmp((char *)sVar5,pvVar4->Name);
      if (iVar3 == 0) break;
      if ((CurPageIndex == 0x3f) && (local_1078 != 0)) {
        memset(local_2084,0,0x1000);
        sVar5 = VirtualPage::NearestTableIndex(local_1078);
        Read<sai::VirtualPage>(this,sVar5 << 0xc,(VirtualPage *)local_2084);
        pvVar6 = std::array<sai::VirtualPage::PageEntry,_512UL>::operator[]
                           ((array<sai::VirtualPage::PageEntry,_512UL> *)local_2084,local_1078);
        uVar2 = pvVar6->NextPageIndex;
        if (uVar2 == 0) goto LAB_0010ff63;
        Read<sai::VirtualPage>(this,(ulong)uVar2 << 0xc,(VirtualPage *)((long)&CurPath.field_2 + 8))
        ;
        CurPageIndex = 0;
        local_1078 = (ulong)uVar2;
      }
      else {
LAB_0010ff63:
        CurPageIndex = CurPageIndex + 1;
      }
    }
    CurEntry = (size_t)strtok((char *)0x0,CurToken);
    if ((char *)CurEntry == (char *)0x0) {
      pvVar4 = std::array<sai::FATEntry,_64UL>::operator[]
                         ((array<sai::FATEntry,_64UL> *)((long)&CurPath.field_2 + 8),CurPageIndex);
      std::make_optional<sai::VirtualFileEntry,std::shared_ptr<sai::ifstream>&,sai::FATEntry&>
                (__return_storage_ptr__,&this->FileStream,pvVar4);
      goto LAB_0010ff90;
    }
    pvVar4 = std::array<sai::FATEntry,_64UL>::operator[]
                       ((array<sai::FATEntry,_64UL> *)((long)&CurPath.field_2 + 8),CurPageIndex);
    if (pvVar4->Type != Folder) {
      std::optional<sai::VirtualFileEntry>::optional(__return_storage_ptr__);
LAB_0010ff90:
      PageIndex = 1;
      std::__cxx11::string::~string((string *)local_1040);
      return __return_storage_ptr__;
    }
    pVVar1 = (VirtualPage *)((long)&CurPath.field_2 + 8);
    pvVar4 = std::array<sai::FATEntry,_64UL>::operator[](&pVVar1->FATEntries,CurPageIndex);
    TablePage.u32._M_elems[0x3fe] = pvVar4->PageIndex;
    Read<sai::VirtualPage>(this,(ulong)TablePage.u32._M_elems[0x3fe] << 0xc,pVVar1);
    CurPageIndex = 0;
    local_1078 = (ulong)TablePage.u32._M_elems[0x3fe];
  } while( true );
}

Assistant:

std::optional<VirtualFileEntry> VirtualFileSystem::GetEntry(const char* Path)
{
	VirtualPage CurPage = {};
	Read(2 * VirtualPage::PageSize, CurPage);

	std::string CurPath(Path);
	const char* PathDelim    = "./";
	const char* CurToken     = std::strtok(&CurPath[0], PathDelim);
	std::size_t CurEntry     = 0;
	std::size_t CurPageIndex = 0;

	while( CurEntry < 64 && CurPage.FATEntries[CurEntry].Flags && CurToken )
	{
		if( std::strcmp(CurToken, CurPage.FATEntries[CurEntry].Name) == 0 )
		{
			// Match
			if( (CurToken = std::strtok(nullptr, PathDelim)) == nullptr )
			{
				// No more tokens, done
				return std::make_optional<VirtualFileEntry>(
					FileStream, CurPage.FATEntries[CurEntry]
				);
			}
			// Try to go further
			if( CurPage.FATEntries[CurEntry].Type != FATEntry::EntryType::Folder )
			{
				// Part of the path was not a folder, cant go further
				return std::nullopt;
			}

			const std::uint32_t PageIndex = CurPage.FATEntries[CurEntry].PageIndex;
			Read(PageIndex * VirtualPage::PageSize, CurPage);
			CurEntry     = 0;
			CurPageIndex = PageIndex;
			continue;
		}

		// Last entry ( of this Page ), check if there are more after this.
		if( CurEntry == 63 && CurPageIndex )
		{
			// If a folder has more than 64 `FATEntries`, the `NextPageIndex`
			// field on the `PageEntry` will indicate on what `Page` the extra
			// entries are located.
			VirtualPage TablePage = {};
			Read(VirtualPage::NearestTableIndex(CurPageIndex) * VirtualPage::PageSize, TablePage);

			const std::uint32_t NextPageIndex = TablePage.PageEntries[CurPageIndex].NextPageIndex;
			if( NextPageIndex )
			{
				Read(NextPageIndex * VirtualPage::PageSize, CurPage);
				CurEntry     = 0;
				CurPageIndex = NextPageIndex;
				continue;
			}
		}

		CurEntry++;
	}

	return std::nullopt;
}